

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  bool bVar1;
  bool bVar2;
  ExecutionModel EVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  SPIRVariable *var;
  Bitset *pBVar7;
  undefined4 in_register_0000000c;
  uint *ts_1;
  Variant *pVVar8;
  undefined3 in_register_00000081;
  char *addr_space;
  Bitset flags;
  allocator local_bd;
  uint local_bc;
  uint32_t local_b8;
  uint32_t local_b4;
  Bitset local_b0;
  Bitset local_70;
  
  local_bc = CONCAT31(in_register_00000081,argument);
  pVVar8 = (Variant *)CONCAT44(in_register_0000000c,id);
  local_70.lower = 0;
  local_70.higher._M_h._M_buckets = &local_70.higher._M_h._M_single_bucket;
  local_70.higher._M_h._M_bucket_count = 1;
  local_70.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70.higher._M_h._M_element_count = 0;
  local_70.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_70.higher._M_h._M_rehash_policy._M_next_resize = 0;
  local_70.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar6 = (ulong)id;
  if ((uVar6 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar8 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar8[uVar6].type == TypeVariable)) {
    var = Variant::get<spirv_cross::SPIRVariable>(pVVar8 + uVar6);
  }
  else {
    var = (SPIRVariable *)0x0;
  }
  if (((var == (SPIRVariable *)0x0) || (type->basetype != Struct)) ||
     ((bVar1 = Compiler::has_decoration((Compiler *)this,(ID)(type->super_IVariant).self.id,Block),
      !bVar1 && (bVar1 = Compiler::has_decoration
                                   ((Compiler *)this,(ID)(type->super_IVariant).self.id,BufferBlock)
                , !bVar1)))) {
    pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    pVVar8 = (Variant *)pBVar7->lower;
    local_70.lower = (uint64_t)pVVar8;
    if (pBVar7 != &local_70) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_70.higher,&(pBVar7->higher)._M_h);
    }
  }
  else {
    Compiler::get_buffer_block_flags(&local_b0,(Compiler *)this,(VariableID)id);
    local_70.lower = local_b0.lower;
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&local_70.higher._M_h,&local_b0.higher);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_b0.higher._M_h);
  }
  local_b0.lower = 0;
  ts_1 = &switchD_00295fc0::switchdataD_003f8f00;
  switch(type->storage) {
  case StorageClassUniformConstant:
  case StorageClassUniform:
  case PushConstant:
    if (type->basetype == Struct) {
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,BufferBlock);
      pVVar8 = (Variant *)0x4053f9;
      if (((uint)local_70.lower >> 0x18 & 1) == 0) {
        pVVar8 = (Variant *)0x3fd1a4;
      }
      ts_1 = (uint *)(Variant *)0x3bf769;
      local_b0.lower = (uint64_t)(Variant *)0x3bf769;
      if (bVar1) {
        ts_1 = (uint *)pVVar8;
        local_b0.lower = (uint64_t)pVVar8;
      }
    }
    else if ((char)local_bc == '\0') {
      local_b0.lower = (uint64_t)(Variant *)0x3bf769;
    }
    else if (((type->basetype == Image) && ((type->image).dim == DimSubpassData)) &&
            ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
      local_b0.lower = (uint64_t)(Variant *)0x3edd35;
    }
    break;
  case Input:
    EVar3 = Compiler::get_execution_model((Compiler *)this);
    if ((((var != (SPIRVariable *)0x0) && (EVar3 == ExecutionModelTessellationControl)) &&
        ((var->basevariable).id == (this->stage_in_ptr_var_id).id)) &&
       (ts_1 = (uint *)0x3fd257, local_b0.lower = (uint64_t)ts_1,
       (this->msl_options).multi_patch_workgroup != false)) {
      ts_1 = (uint *)0x4053f9;
      local_b0.lower = (uint64_t)ts_1;
    }
    EVar3 = Compiler::get_execution_model((Compiler *)this);
    if (((EVar3 == ExecutionModelTessellationEvaluation) && (var != (SPIRVariable *)0x0)) &&
       (((this->msl_options).raw_buffer_tese_input & 1U) != 0)) {
      local_b4 = (var->basevariable).id;
      local_b8 = (this->stage_in_ptr_var_id).id;
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPatch);
      bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
      uVar4 = Compiler::get_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
      ts_1 = (uint *)(ulong)local_b8;
      if ((local_b4 == local_b8) || (bVar1 && (!bVar2 || 1 < uVar4 - 0xb))) {
        local_b0.lower = 0x4053f9;
      }
    }
    EVar3 = Compiler::get_execution_model((Compiler *)this);
    if (((var != (SPIRVariable *)0x0) && (EVar3 == ExecutionModelFragment)) &&
       ((var->basevariable).id == (this->stage_in_var_id).id)) {
      local_b0.lower = (uint64_t)(Variant *)0x3fd124;
    }
    break;
  case Output:
    if (this->capture_output_to_buffer != true) break;
    if (var != (SPIRVariable *)0x0) {
      bVar1 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
      if (bVar1) {
        bVar1 = Compiler::is_tessellation_shader((Compiler *)this);
        if (bVar1) {
LAB_002961ff:
          local_b0.lower = 0x3fd257;
        }
        else {
          local_b0.lower = 0x3fd124;
        }
      }
      else {
        iVar5 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,var,4);
        if ((char)iVar5 != '\0') goto LAB_002961ff;
      }
    }
    if ((Variant *)local_b0.lower != (Variant *)0x0) break;
    goto LAB_00296213;
  case StorageClassWorkgroup:
    local_b0.lower = (uint64_t)(Variant *)0x3fd257;
    break;
  case CrossWorkgroup:
  case Private:
  case Function:
  case Generic:
  case AtomicCounter:
  case Image:
    break;
  default:
    ts_1 = (uint *)pVVar8;
    if (type->storage != PhysicalStorageBuffer) break;
  case StorageBuffer:
    if ((var == (SPIRVariable *)0x0) ||
       (bVar1 = Compiler::has_decoration((Compiler *)this,(ID)(type->super_IVariant).self.id,Block),
       bVar1)) {
      ts_1 = (uint *)(Variant *)0x3fd1a4;
      local_b0.lower = (uint64_t)(Variant *)0x4053f9;
      if ((local_70.lower & 0x1000000) == 0) {
        local_b0.lower = (uint64_t)(Variant *)0x3fd1a4;
      }
    }
    else {
LAB_00296213:
      local_b0.lower = (uint64_t)(Variant *)0x3fd1a4;
    }
  }
  if ((Variant *)local_b0.lower == (Variant *)0x0) {
    ts_1 = (uint *)0x3edd35;
    local_b0.lower = 0x3edd35;
    if (type->basetype == ControlPointArray) {
      local_b0.lower = 0x3fd124;
    }
    if ((local_bc & 1) == 0) {
      local_b0.lower = 0x3edd35;
    }
    if (type->pointer != false) {
      local_b0.lower = 0x3fd124;
    }
  }
  if (((local_70.lower & 0xa00000) == 0) ||
     (iVar5 = strcmp((char *)local_b0.lower,"thread"), iVar5 == 0)) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(char *)local_b0.lower,&local_bd);
  }
  else {
    join<char_const(&)[10],char_const*&>
              (__return_storage_ptr__,(spirv_cross *)"volatile ",(char (*) [10])&local_b0,
               (char **)ts_1);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70.higher._M_h);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	if (decoration_flags_signal_volatile(flags) && 0 != strcmp(addr_space, "thread"))
		return join("volatile ", addr_space);
	else
		return addr_space;
}